

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O2

void __thiscall ROM::Request::Node::sort(Node *this)

{
  pointer pNVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  
  lVar2 = ((long)(this->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)(this->children).
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x28;
  bVar3 = 0;
  lVar4 = lVar2 * 0x28;
  for (; 0 < lVar2; lVar2 = lVar2 + -1) {
    pNVar1 = (this->children).
             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = bVar3 & 1 | (&pNVar1[-1].is_optional)[lVar4] ^ 1U;
    if (((&pNVar1[-1].is_optional)[lVar4] == true) && (bVar3 != 0)) {
      std::_V2::
      __rotate<__gnu_cxx::__normal_iterator<ROM::Request::Node*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>>
                ((long)&pNVar1[-1].type + lVar4,(long)&pNVar1->type + lVar4,
                 (this->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    }
    lVar4 = lVar4 + -0x28;
  }
  return;
}

Assistant:

void sort() {
				// Don't do a full sort, but move anything optional to the back.
				// This makes them print more nicely; it's a human-facing tweak only.
				ssize_t index = ssize_t(children.size() - 1);
				bool has_seen_non_optional = false;
				while(index >= 0) {
					has_seen_non_optional |= !children[size_t(index)].is_optional;
					if(children[size_t(index)].is_optional && has_seen_non_optional) {
						std::rotate(children.begin() + index, children.begin() + index + 1, children.end());
					}
					--index;
				}
			}